

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateProgramOutputBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask,bool includeEmpty,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr
               *genCase)

{
  deInt32 *pdVar1;
  NodeType NVar2;
  ShaderType SVar3;
  Node *pNVar4;
  SharedPtrStateBase *pSVar5;
  Node *pNVar6;
  SharedPtr variable_1;
  SharedPtr variable;
  SharedPtr variable_2;
  SharedPtr output;
  SharedPtr local_88;
  SharedPtr local_78;
  SharedPtr local_68;
  Node *local_58;
  SharedPtrStateBase *pSStack_50;
  Context *local_48;
  TestCaseGroup *local_40;
  deUint32 local_34;
  
  pNVar4 = parentStructure->m_ptr;
  NVar2 = pNVar4->m_type;
  local_48 = context;
  local_40 = targetGroup;
  if (NVar2 == TYPE_DEFAULT_BLOCK) {
    local_34 = presentShadersMask;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar6->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar6->m_enclosingNode).m_ptr = pNVar4;
    pSVar5 = parentStructure->m_state;
    (pNVar6->m_enclosingNode).m_state = pSVar5;
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a6fc8;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 1;
    pSStack_50 = (SharedPtrStateBase *)0x0;
    local_58 = pNVar6;
    pSStack_50 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_50->strongRefCount = 0;
    pSStack_50->weakRefCount = 0;
    pSStack_50->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSStack_50[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSStack_50->strongRefCount = 1;
    pSStack_50->weakRefCount = 1;
    presentShadersMask = local_34;
  }
  else {
    pSStack_50 = parentStructure->m_state;
    local_58 = pNVar4;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pSStack_50->weakRefCount = pSStack_50->weakRefCount + 1;
      UNLOCK();
    }
  }
  SVar3 = getShaderMaskLastStage(presentShadersMask);
  if (includeEmpty && NVar2 == TYPE_DEFAULT_BLOCK) {
    (*genCase)(local_48,parentStructure,local_40,PROGRAMINTERFACE_PROGRAM_OUTPUT,"empty");
  }
  if (((NVar2 == TYPE_DEFAULT_BLOCK) && (SVar3 != SHADERTYPE_TESSELLATION_EVALUATION)) &&
     ((SVar3 & ~SHADERTYPE_GEOMETRY) != SHADERTYPE_VERTEX)) {
    if (SVar3 == SHADERTYPE_TESSELLATION_CONTROL) {
      pNVar4 = (Node *)operator_new(0x28);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar4->m_type = TYPE_STORAGE_QUALIFIER;
      (pNVar4->m_enclosingNode).m_ptr = parentStructure->m_ptr;
      pSVar5 = parentStructure->m_state;
      (pNVar4->m_enclosingNode).m_state = pSVar5;
      if (pSVar5 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a6fc8;
      *(undefined4 *)&pNVar4[1]._vptr_Node = 6;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar4;
      local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_78.m_state)->strongRefCount = 0;
      (local_78.m_state)->weakRefCount = 0;
      (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      (local_78.m_state)->strongRefCount = 1;
      (local_78.m_state)->weakRefCount = 1;
      pNVar4 = (Node *)operator_new(0x28);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar4->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar4->m_enclosingNode).m_ptr = local_58;
      (pNVar4->m_enclosingNode).m_state = pSStack_50;
      if (pSStack_50 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
      *(undefined4 *)&pNVar4[1]._vptr_Node = 0xfffffffe;
      local_88.m_state = (SharedPtrStateBase *)0x0;
      local_88.m_ptr = pNVar4;
      pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar5->strongRefCount = 0;
      pSVar5->weakRefCount = 0;
      pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar5->strongRefCount = 1;
      pSVar5->weakRefCount = 1;
      local_88.m_state = pSVar5;
      pNVar6 = (Node *)operator_new(0x28);
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar6->m_type = TYPE_VARIABLE;
      (pNVar6->m_enclosingNode).m_ptr = pNVar4;
      (pNVar6->m_enclosingNode).m_state = pSVar5;
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
      *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
      local_68.m_state = (SharedPtrStateBase *)0x0;
      local_68.m_ptr = pNVar6;
      local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_68.m_state)->strongRefCount = 0;
      (local_68.m_state)->weakRefCount = 0;
      (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
      (local_68.m_state)->strongRefCount = 1;
      (local_68.m_state)->weakRefCount = 1;
      (*genCase)(local_48,&local_68,local_40,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var");
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_68.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_68.m_ptr = (Node *)0x0;
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_68.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_68.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_68.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_88.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_88.m_ptr = (Node *)0x0;
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_88.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_88.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_88.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pNVar4 = (Node *)operator_new(0x28);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar4->m_type = TYPE_VARIABLE;
      (pNVar4->m_enclosingNode).m_ptr = local_78.m_ptr;
      (pNVar4->m_enclosingNode).m_state = local_78.m_state;
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
      *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
      local_88.m_state = (SharedPtrStateBase *)0x0;
      local_88.m_ptr = pNVar4;
      local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_88.m_state)->strongRefCount = 0;
      (local_88.m_state)->weakRefCount = 0;
      (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      (local_88.m_state)->strongRefCount = 1;
      (local_88.m_state)->weakRefCount = 1;
      (*genCase)(local_48,&local_88,local_40,PROGRAMINTERFACE_PROGRAM_OUTPUT,"patch_var");
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_88.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_88.m_ptr = (Node *)0x0;
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_88.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_88.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_88.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pNVar4 = (Node *)operator_new(0x20);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar4->m_type = TYPE_STRUCT_MEMBER;
      (pNVar4->m_enclosingNode).m_ptr = local_78.m_ptr;
      (pNVar4->m_enclosingNode).m_state = local_78.m_state;
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a70f8;
      local_88.m_state = (SharedPtrStateBase *)0x0;
      local_88.m_ptr = pNVar4;
      pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar5->strongRefCount = 0;
      pSVar5->weakRefCount = 0;
      pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar5->strongRefCount = 1;
      pSVar5->weakRefCount = 1;
      local_88.m_state = pSVar5;
      pNVar6 = (Node *)operator_new(0x28);
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar6->m_type = TYPE_VARIABLE;
      (pNVar6->m_enclosingNode).m_ptr = pNVar4;
      (pNVar6->m_enclosingNode).m_state = pSVar5;
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
      *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
      local_68.m_state = (SharedPtrStateBase *)0x0;
      local_68.m_ptr = pNVar6;
      local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_68.m_state)->strongRefCount = 0;
      (local_68.m_state)->weakRefCount = 0;
      (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
      (local_68.m_state)->strongRefCount = 1;
      (local_68.m_state)->weakRefCount = 1;
      (*genCase)(local_48,&local_68,local_40,PROGRAMINTERFACE_PROGRAM_OUTPUT,"patch_var_struct");
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_68.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_68.m_ptr = (Node *)0x0;
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_68.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_68.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_68.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_88.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_88.m_ptr = (Node *)0x0;
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_88.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_88.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_88.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pNVar4 = (Node *)operator_new(0x28);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar4->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar4->m_enclosingNode).m_ptr = local_78.m_ptr;
      (pNVar4->m_enclosingNode).m_state = local_78.m_state;
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
      *(undefined4 *)&pNVar4[1]._vptr_Node = 0xffffffff;
      local_88.m_state = (SharedPtrStateBase *)0x0;
      local_88.m_ptr = pNVar4;
      pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar5->strongRefCount = 0;
      pSVar5->weakRefCount = 0;
      pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar5->strongRefCount = 1;
      pSVar5->weakRefCount = 1;
      local_88.m_state = pSVar5;
      pNVar6 = (Node *)operator_new(0x28);
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar6->m_type = TYPE_VARIABLE;
      (pNVar6->m_enclosingNode).m_ptr = pNVar4;
      (pNVar6->m_enclosingNode).m_state = pSVar5;
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
      *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
      local_68.m_state = (SharedPtrStateBase *)0x0;
      local_68.m_ptr = pNVar6;
      local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_68.m_state)->strongRefCount = 0;
      (local_68.m_state)->weakRefCount = 0;
      (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
      (local_68.m_state)->strongRefCount = 1;
      (local_68.m_state)->weakRefCount = 1;
      (*genCase)(local_48,&local_68,local_40,PROGRAMINTERFACE_PROGRAM_OUTPUT,"patch_var_array");
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_68.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_68.m_ptr = (Node *)0x0;
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_68.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_68.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_68.m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      if (SVar3 != SHADERTYPE_FRAGMENT) goto LAB_015a26a9;
      pNVar4 = (Node *)operator_new(0x28);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar4->m_type = TYPE_VARIABLE;
      (pNVar4->m_enclosingNode).m_ptr = local_58;
      (pNVar4->m_enclosingNode).m_state = pSStack_50;
      if (pSStack_50 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
      *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar4;
      local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_78.m_state)->strongRefCount = 0;
      (local_78.m_state)->weakRefCount = 0;
      (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      (local_78.m_state)->strongRefCount = 1;
      (local_78.m_state)->weakRefCount = 1;
      (*genCase)(local_48,&local_78,local_40,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var");
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_78.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_78.m_ptr = (Node *)0x0;
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_78.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_78.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_78.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pNVar4 = (Node *)operator_new(0x28);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar4->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar4->m_enclosingNode).m_ptr = local_58;
      (pNVar4->m_enclosingNode).m_state = pSStack_50;
      if (pSStack_50 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
      *(undefined4 *)&pNVar4[1]._vptr_Node = 0xffffffff;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar4;
      pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar5->strongRefCount = 0;
      pSVar5->weakRefCount = 0;
      pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar5->strongRefCount = 1;
      pSVar5->weakRefCount = 1;
      local_78.m_state = pSVar5;
      pNVar6 = (Node *)operator_new(0x28);
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar6->m_type = TYPE_VARIABLE;
      (pNVar6->m_enclosingNode).m_ptr = pNVar4;
      (pNVar6->m_enclosingNode).m_state = pSVar5;
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
      *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
      local_88.m_state = (SharedPtrStateBase *)0x0;
      local_88.m_ptr = pNVar6;
      local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_88.m_state)->strongRefCount = 0;
      (local_88.m_state)->weakRefCount = 0;
      (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
      (local_88.m_state)->strongRefCount = 1;
      (local_88.m_state)->weakRefCount = 1;
      (*genCase)(local_48,&local_88,local_40,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var_array");
    }
  }
  else {
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = local_58;
    (pNVar4->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar4;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    (*genCase)(local_48,&local_78,local_40,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var");
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_78.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_78.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar4 = (Node *)operator_new(0x20);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar4->m_type = TYPE_STRUCT_MEMBER;
    (pNVar4->m_enclosingNode).m_ptr = local_58;
    (pNVar4->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a70f8;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar4;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    local_78.m_state = pSVar5;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar6->m_type = TYPE_VARIABLE;
    (pNVar6->m_enclosingNode).m_ptr = pNVar4;
    (pNVar6->m_enclosingNode).m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar6;
    local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_88.m_state)->strongRefCount = 0;
    (local_88.m_state)->weakRefCount = 0;
    (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    (local_88.m_state)->strongRefCount = 1;
    (local_88.m_state)->weakRefCount = 1;
    (*genCase)(local_48,&local_88,local_40,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var_struct");
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_88.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_88.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_88.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_78.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_78.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar4->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar4->m_enclosingNode).m_ptr = local_58;
    (pNVar4->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0xffffffff;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar4;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    local_78.m_state = pSVar5;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar6->m_type = TYPE_VARIABLE;
    (pNVar6->m_enclosingNode).m_ptr = pNVar4;
    (pNVar6->m_enclosingNode).m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar6;
    local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_88.m_state)->strongRefCount = 0;
    (local_88.m_state)->weakRefCount = 0;
    (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    (local_88.m_state)->strongRefCount = 1;
    (local_88.m_state)->weakRefCount = 1;
    (*genCase)(local_48,&local_88,local_40,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var_array");
  }
  if (local_88.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_88.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_88.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_78.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_78.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
  }
LAB_015a26a9:
  if (pSStack_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_50->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_58 = (Node *)0x0;
      (*pSStack_50->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSStack_50->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (pSStack_50 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_50->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateProgramOutputBlockContents (Context&										context,
												const ResourceDefinition::Node::SharedPtr&		parentStructure,
												tcu::TestCaseGroup*								targetGroup,
												deUint32										presentShadersMask,
												bool											includeEmpty,
												void											(*genCase)(Context&										context,
																										   const ResourceDefinition::Node::SharedPtr&	parentStructure,
																										   tcu::TestCaseGroup*							targetGroup,
																										   ProgramInterface								interface,
																										   const char*									name))
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	output			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_OUT)))
																	: (parentStructure);
	const glu::ShaderType						lastStage		= getShaderMaskLastStage(presentShadersMask);

	// .empty
	if (includeEmpty && inDefaultBlock)
		genCase(context, parentStructure, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "empty");

	if (lastStage == glu::SHADERTYPE_VERTEX						||
		lastStage == glu::SHADERTYPE_GEOMETRY					||
		lastStage == glu::SHADERTYPE_TESSELLATION_EVALUATION	||
		!inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(output, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var");
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var_struct");
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var_array");
		}
	}
	else if (lastStage == glu::SHADERTYPE_FRAGMENT)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(output, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var");
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var_array");
		}
	}
	else if (lastStage == glu::SHADERTYPE_TESSELLATION_CONTROL)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchOutput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_OUT));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var");
		}
		// extension forbids use arrays of structs
		// extension forbids use array of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchOutput, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "patch_var");
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchOutput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "patch_var_struct");
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchOutput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "patch_var_array");
		}
	}
	else if (lastStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}